

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>::
emplaceRealloc<slang::parsing::Preprocessor::BranchEntry>
          (SmallVectorBase<slang::parsing::Preprocessor::BranchEntry> *this,pointer pos,
          BranchEntry *args)

{
  ulong uVar1;
  undefined8 *puVar2;
  Info *pIVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  bool bVar7;
  bool bVar8;
  undefined5 uVar9;
  BranchEntry *__cur_1;
  pointer pBVar10;
  pointer pBVar11;
  pointer pBVar12;
  pointer pBVar13;
  EVP_PKEY_CTX *pEVar14;
  EVP_PKEY_CTX *ctx;
  long lVar15;
  
  if (this->len == 0x555555555555555) {
    detail::throwLengthError();
  }
  pEVar14 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar1 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar1 * 2);
  if (pEVar14 < ctx) {
    pEVar14 = ctx;
  }
  if (0x555555555555555 - uVar1 < uVar1) {
    pEVar14 = (EVP_PKEY_CTX *)0x555555555555555;
  }
  lVar15 = (long)pos - (long)this->data_;
  pBVar10 = (pointer)operator_new((long)pEVar14 * 0x18);
  *(undefined8 *)((long)pBVar10 + lVar15 + 0x10) = *(undefined8 *)&args->anyTaken;
  pIVar3 = (args->directive).info;
  *(undefined8 *)((long)pBVar10 + lVar15) = *(undefined8 *)&args->directive;
  ((undefined8 *)((long)pBVar10 + lVar15))[1] = pIVar3;
  pBVar13 = this->data_;
  pBVar11 = pBVar13 + this->len;
  pBVar12 = pBVar10;
  if (pBVar11 == pos) {
    for (; pBVar13 != pos; pBVar13 = pBVar13 + 1) {
      bVar7 = pBVar13->currentActive;
      bVar8 = pBVar13->hasElse;
      uVar9 = *(undefined5 *)&pBVar13->field_0x13;
      pBVar12->anyTaken = pBVar13->anyTaken;
      pBVar12->currentActive = bVar7;
      pBVar12->hasElse = bVar8;
      *(undefined5 *)&pBVar12->field_0x13 = uVar9;
      uVar4 = (pBVar13->directive).field_0x2;
      NVar5.raw = (pBVar13->directive).numFlags.raw;
      uVar6 = (pBVar13->directive).rawLen;
      pIVar3 = (pBVar13->directive).info;
      (pBVar12->directive).kind = (pBVar13->directive).kind;
      (pBVar12->directive).field_0x2 = uVar4;
      (pBVar12->directive).numFlags = (NumericTokenFlags)NVar5.raw;
      (pBVar12->directive).rawLen = uVar6;
      (pBVar12->directive).info = pIVar3;
      pBVar12 = pBVar12 + 1;
    }
  }
  else {
    for (; pBVar13 != pos; pBVar13 = pBVar13 + 1) {
      ctx = *(EVP_PKEY_CTX **)&pBVar13->anyTaken;
      *(EVP_PKEY_CTX **)&pBVar12->anyTaken = ctx;
      uVar4 = (pBVar13->directive).field_0x2;
      NVar5.raw = (pBVar13->directive).numFlags.raw;
      uVar6 = (pBVar13->directive).rawLen;
      pIVar3 = (pBVar13->directive).info;
      (pBVar12->directive).kind = (pBVar13->directive).kind;
      (pBVar12->directive).field_0x2 = uVar4;
      (pBVar12->directive).numFlags = (NumericTokenFlags)NVar5.raw;
      (pBVar12->directive).rawLen = uVar6;
      (pBVar12->directive).info = pIVar3;
      pBVar12 = pBVar12 + 1;
    }
    puVar2 = (undefined8 *)(lVar15 + (long)pBVar10);
    for (; pos != pBVar11; pos = pos + 1) {
      puVar2[5] = *(undefined8 *)&pos->anyTaken;
      pIVar3 = (pos->directive).info;
      puVar2[3] = *(undefined8 *)&pos->directive;
      puVar2[4] = pIVar3;
      puVar2 = puVar2 + 3;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar14;
  this->data_ = pBVar10;
  return (pointer)((long)pBVar10 + lVar15);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}